

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gia_GlaPrepareCexAndMap(Gla_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMap)

{
  Gla_Obj_t *pGVar1;
  sat_solver2 *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  Gla_Obj_t *pGVar9;
  Abc_Cex_t *pAVar10;
  ulong uVar11;
  int iFrame;
  long lVar12;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  pVVar7 = p->vAbs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      lVar8 = (long)pVVar7->pArray[lVar12];
      if ((lVar8 < 0) || (p->nObjs <= pVVar7->pArray[lVar12])) {
LAB_0055d5da:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if ((pGVar1[lVar8].field_0x4 & 0xa4) == 0) {
        __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0xa0,"void Gia_GlaPrepareCexAndMap(Gla_Man_t *, Abc_Cex_t **, Vec_Int_t **)")
        ;
      }
      if (0x1ff < *(uint *)&pGVar1[lVar8].field_0x4) {
        uVar11 = 0;
        do {
          iVar4 = pGVar1[lVar8].Fanins[uVar11];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0055d5da;
          if (iVar4 == 0) {
            pGVar9 = (Gla_Obj_t *)0x0;
          }
          else {
            pGVar9 = p->pObjs + iVar4;
          }
          if ((pGVar9->field_0x4 & 1) == 0) {
            Vec_IntPush(p_00,pGVar9->iGiaObj);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < *(uint *)&pGVar1[lVar8].field_0x4 >> 9);
      }
      lVar12 = lVar12 + 1;
      pVVar7 = p->vAbs;
    } while (lVar12 < pVVar7->nSize);
  }
  if (1 < (long)p_00->nSize) {
    qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
    iVar4 = 1;
    if (1 < p_00->nSize) {
      piVar6 = p_00->pArray;
      lVar12 = 1;
      do {
        if (piVar6[lVar12] != piVar6[lVar12 + -1]) {
          lVar8 = (long)iVar4;
          iVar4 = iVar4 + 1;
          piVar6[lVar8] = piVar6[lVar12];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < p_00->nSize);
    }
    p_00->nSize = iVar4;
  }
  pAVar10 = Abc_CexAlloc(0,p_00->nSize,p->pPars->iFrame + 1);
  iVar4 = p->pPars->iFrame;
  pAVar10->iFrame = iVar4;
  iFrame = 0;
  if (-1 < iVar4) {
    do {
      if (0 < p_00->nSize) {
        lVar12 = 0;
        do {
          lVar8 = (long)p_00->pArray[lVar12];
          if ((lVar8 < 0) || (p->pGia->nObjs <= p_00->pArray[lVar12])) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
          iVar4 = Gla_ManCheckVar(p,p->pObj2Obj[lVar8],iFrame);
          if (iVar4 != 0) {
            psVar2 = p->pSat;
            uVar5 = Gla_ManGetVar(p,p->pObj2Obj[lVar8],iFrame);
            if (((int)uVar5 < 0) || (psVar2->size <= (int)uVar5)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                            ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
            }
            if (psVar2->model[uVar5] == 1) {
              iVar4 = p_00->nSize * iFrame + (int)lVar12;
              (&pAVar10[1].iPo)[iVar4 >> 5] =
                   (&pAVar10[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < p_00->nSize);
      }
      bVar3 = iFrame < p->pPars->iFrame;
      iFrame = iFrame + 1;
    } while (bVar3);
  }
  *pvMap = p_00;
  *ppCex = pAVar10;
  return;
}

Assistant:

void Gia_GlaPrepareCexAndMap( Gla_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMap )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gla_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pGiaObj;
    int f, i, k;
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( vMap, pFanin->iGiaObj );
    }
    Vec_IntUniqify( vMap );
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pGiaObj, k )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pGiaObj), f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMap = vMap;
    *ppCex = pCex;
}